

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O0

CBString * phoenixFlashMapGuidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid)

{
  bool bVar1;
  undefined1 local_38 [8];
  UByteArray baGuid;
  EFI_GUID *guid_local;
  
  baGuid.d.field_2._8_8_ = guid;
  UByteArray::UByteArray((UByteArray *)local_38,(char *)guid,0x10);
  bVar1 = UByteArray::operator==((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER);
  if (bVar1) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Volume header");
  }
  else {
    bVar1 = UByteArray::operator==((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID);
    if (bVar1) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Microcodes");
    }
    else {
      bVar1 = UByteArray::operator==((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID);
      if (bVar1) {
        Bstrlib::CBString::CBString(__return_storage_ptr__,"CMDB");
      }
      else {
        bVar1 = UByteArray::operator==((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID)
        ;
        if (!bVar1) {
          bVar1 = UByteArray::operator==
                            ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID);
          if (!bVar1) {
            bVar1 = UByteArray::operator==
                              ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID);
            if (!bVar1) {
              bVar1 = UByteArray::operator==
                                ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID);
              if (!bVar1) {
                bVar1 = UByteArray::operator==
                                  ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID);
                if (!bVar1) {
                  bVar1 = UByteArray::operator==
                                    ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID);
                  if (!bVar1) {
                    bVar1 = UByteArray::operator==
                                      ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID);
                    if (!bVar1) {
                      bVar1 = UByteArray::operator==
                                        ((UByteArray *)local_38,&NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID)
                      ;
                      if (!bVar1) {
                        bVar1 = UByteArray::operator==
                                          ((UByteArray *)local_38,
                                           &NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID);
                        if (!bVar1) {
                          bVar1 = UByteArray::operator==
                                            ((UByteArray *)local_38,
                                             &NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID);
                          if (!bVar1) {
                            bVar1 = UByteArray::operator==
                                              ((UByteArray *)local_38,
                                               &NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID);
                            if (!bVar1) {
                              bVar1 = UByteArray::operator==
                                                ((UByteArray *)local_38,
                                                 &NVRAM_PHOENIX_FLASH_MAP_SELF_GUID);
                              if (bVar1) {
                                Bstrlib::CBString::CBString(__return_storage_ptr__,"Flash map");
                              }
                              else {
                                bVar1 = UByteArray::operator==((UByteArray *)local_38,&ZERO_GUID);
                                if (bVar1) {
                                  Bstrlib::CBString::CBString(__return_storage_ptr__);
                                }
                                else {
                                  Bstrlib::CBString::CBString(__return_storage_ptr__,"Unknown");
                                }
                              }
                              goto LAB_0011d61f;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                Bstrlib::CBString::CBString(__return_storage_ptr__,"EVSA store");
                goto LAB_0011d61f;
              }
            }
            Bstrlib::CBString::CBString(__return_storage_ptr__,"SLIC marker");
            goto LAB_0011d61f;
          }
        }
        Bstrlib::CBString::CBString(__return_storage_ptr__,"SLIC pubkey");
      }
    }
  }
LAB_0011d61f:
  UByteArray::~UByteArray((UByteArray *)local_38);
  return __return_storage_ptr__;
}

Assistant:

UString phoenixFlashMapGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER)        return UString("Volume header");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID)      return UString("Microcodes");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID)            return UString("CMDB");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID)      return UString("SLIC pubkey");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID)      return UString("SLIC marker");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID)        return UString("EVSA store");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID)            return UString("Flash map");
    if (baGuid == ZERO_GUID)                                    return UString();
    return UString("Unknown");
}